

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_len_ran_interval(ly_ctx *ctx,char *str_restr,lys_type *type,len_ran_intv **ret)

{
  int64_t *num;
  ushort uVar1;
  uint *puVar2;
  uint *puVar3;
  ulong num1;
  ulong uVar4;
  len_ran_intv *plVar5;
  len_ran_intv *plVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  undefined8 uVar11;
  lys_type_bit *plVar12;
  len_ran_intv *plVar13;
  ushort **ppuVar14;
  ulonglong uVar15;
  uint *puVar16;
  uint *puVar17;
  long lVar18;
  byte bVar19;
  char *pcVar20;
  char *pcVar21;
  uint *puVar22;
  uint *puVar23;
  len_ran_intv *__ptr;
  len_ran_intv *plVar24;
  len_ran_intv *local_80;
  ly_ctx *local_78;
  uint local_6c;
  char *local_68;
  uint *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  uint *local_40;
  uint *local_38;
  
  local_80 = (len_ran_intv *)0x0;
  iVar9 = -1;
  uVar8 = type->base - LY_TYPE_BINARY;
  if (0x12 < uVar8) {
    return -1;
  }
  puVar16 = &switchD_001151a3::switchdataD_001a062c;
  puVar10 = (uint *)((long)&switchD_001151a3::switchdataD_001a062c +
                    (long)(int)(&switchD_001151a3::switchdataD_001a062c)[uVar8]);
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UINT64:
    if (str_restr != (char *)0x0) {
      local_60 = (uint *)0xffffffffffffffff;
      break;
    }
    plVar12 = (type->info).bits.bit;
    local_60 = (uint *)0xffffffffffffffff;
LAB_001153e3:
    local_50 = 0;
    local_58 = CONCAT71((int7)((ulong)puVar16 >> 8),1);
    if (plVar12 != (lys_type_bit *)0x0) {
      local_48 = (ulong)local_48._4_4_ << 0x20;
      local_40 = (uint *)0x0;
      local_38 = (uint *)0x0;
      goto LAB_00115452;
    }
    str_restr = (char *)0x0;
    goto LAB_001152c0;
  default:
    goto switchD_001151a3_caseD_2;
  case LY_TYPE_DEC64:
    bVar19 = (type->info).dec64.dig;
    if (str_restr != (char *)0x0) {
LAB_0011525b:
      local_48 = CONCAT44(local_48._4_4_,2);
      local_40 = (uint *)0x0;
      local_50 = 0;
      local_58 = 0;
      local_38 = (uint *)0x0;
      local_60 = (uint *)0x0;
      goto LAB_00115457;
    }
    plVar12 = (type->info).bits.bit;
    local_48 = CONCAT44(local_48._4_4_,2);
    local_40 = (uint *)0x0;
    local_58 = 0;
    if (plVar12 == (lys_type_bit *)0x0) {
      str_restr = (char *)0x0;
      goto LAB_0011525b;
    }
    local_50 = 0;
    local_38 = (uint *)0x0;
    local_60 = (uint *)0x0;
    goto LAB_00115454;
  case LY_TYPE_INT8:
    if (str_restr == (char *)0x0) {
      plVar12 = (type->info).bits.bit;
      uVar11 = 0;
      local_38 = (uint *)0x7f;
      local_40 = (uint *)0xffffffffffffff80;
      goto LAB_0011542c;
    }
    uVar11 = 0;
    local_38 = (uint *)0x7f;
    local_40 = (uint *)0xffffffffffffff80;
LAB_001152f3:
    local_50 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
LAB_00115308:
    local_48 = CONCAT44(local_48._4_4_,1);
    local_58 = 0;
    local_60 = (uint *)0x0;
    goto LAB_00115310;
  case LY_TYPE_UINT8:
    if (str_restr == (char *)0x0) {
      plVar12 = (type->info).bits.bit;
      puVar16 = (uint *)0xff;
      local_60 = puVar16;
      goto LAB_001153e3;
    }
    puVar10 = (uint *)0xff;
    local_60 = puVar10;
    break;
  case LY_TYPE_INT16:
    if (str_restr != (char *)0x0) {
      uVar11 = 0x7fff;
      local_38 = (uint *)0x7fff;
      local_40 = (uint *)0xffffffffffff8000;
      goto LAB_001152f3;
    }
    plVar12 = (type->info).bits.bit;
    uVar11 = 0x7fff;
    local_38 = (uint *)0x7fff;
    local_40 = (uint *)0xffffffffffff8000;
    goto LAB_0011542c;
  case LY_TYPE_UINT16:
    if (str_restr == (char *)0x0) {
      plVar12 = (type->info).bits.bit;
      puVar16 = (uint *)0xffff;
      local_60 = puVar16;
      goto LAB_001153e3;
    }
    puVar10 = (uint *)0xffff;
    local_60 = puVar10;
    break;
  case LY_TYPE_INT32:
    if (str_restr != (char *)0x0) {
      uVar11 = 0x7fffffff;
      local_38 = (uint *)0x7fffffff;
      local_40 = (uint *)0xffffffff80000000;
      goto LAB_001152f3;
    }
    plVar12 = (type->info).bits.bit;
    uVar11 = 0x7fffffff;
    local_38 = (uint *)0x7fffffff;
    local_40 = (uint *)0xffffffff80000000;
LAB_0011542c:
    local_48 = CONCAT44(local_48._4_4_,1);
    local_50 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
    local_60 = (uint *)0x0;
    local_58 = 0;
    if (plVar12 == (lys_type_bit *)0x0) {
      str_restr = (char *)0x0;
      goto LAB_00115310;
    }
LAB_00115452:
    bVar19 = 0;
LAB_00115454:
    str_restr = plVar12->name;
    goto LAB_00115457;
  case LY_TYPE_UINT32:
    puVar10 = (uint *)0xffffffff;
    local_60 = (uint *)0xffffffff;
    if (str_restr == (char *)0x0) {
      plVar12 = (type->info).bits.bit;
      goto LAB_001153e3;
    }
    break;
  case LY_TYPE_INT64:
    local_38 = (uint *)0x7fffffffffffffff;
    if (str_restr != (char *)0x0) {
      local_40 = (uint *)0x8000000000000000;
      local_50 = 0x8000000000000001;
      goto LAB_00115308;
    }
    plVar12 = (type->info).bits.bit;
    local_40 = (uint *)0x8000000000000000;
    local_60 = (uint *)0x0;
    local_48 = CONCAT44(local_48._4_4_,1);
    local_50 = 0x8000000000000001;
    local_58 = 0;
    if (plVar12 != (lys_type_bit *)0x0) {
      bVar19 = 0;
      goto LAB_00115454;
    }
    str_restr = (char *)0x0;
    bVar19 = 0;
    goto LAB_00115457;
  }
  local_58 = CONCAT71((int7)((ulong)puVar10 >> 8),1);
LAB_001152c0:
  local_50 = 0;
  local_48 = (ulong)local_48._4_4_ << 0x20;
  local_40 = (uint *)0x0;
  local_38 = (uint *)0x0;
LAB_00115310:
  bVar19 = 0;
LAB_00115457:
  local_78 = ctx;
  if (type->der == (lys_tpdf *)0x0) {
LAB_001154bb:
    __ptr = (len_ran_intv *)0x0;
  }
  else {
    iVar9 = resolve_len_ran_interval(ctx,(char *)0x0,&type->der->type,&local_80);
    if (iVar9 != 0) {
      return -1;
    }
    if (local_80 == (len_ran_intv *)0x0) goto LAB_001154bb;
    __ptr = local_80;
    if ((uint)local_48 != local_80->kind) {
      __assert_fail("!intv || (intv->kind == kind)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0xbdf,
                    "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                   );
    }
  }
  if (str_restr != (char *)0x0) {
    puVar10 = (uint *)0x7fffffffffffffff;
    puVar16 = local_38;
    if (__ptr == (len_ran_intv *)0x0) {
      puVar22 = (uint *)0x8000000000000000;
      puVar23 = (uint *)0x0;
      puVar2 = local_60;
    }
    else {
      puVar2 = (uint *)(__ptr->value).uval.min;
      puVar17 = local_40;
      if ((char)local_50 != '\0') {
        puVar17 = puVar2;
      }
      puVar22 = puVar2;
      if ((char)local_50 != '\0') {
        puVar22 = (uint *)0x8000000000000000;
      }
      puVar23 = (uint *)0x0;
      if ((char)local_58 != '\0') {
        puVar23 = puVar2;
        puVar22 = (uint *)0x8000000000000000;
        puVar17 = local_40;
      }
      do {
        local_40 = puVar17;
        plVar24 = __ptr;
        __ptr = plVar24->next;
        puVar17 = local_40;
      } while (__ptr != (len_ran_intv *)0x0);
      puVar17 = (uint *)(plVar24->value).sval.max;
      puVar2 = puVar17;
      if (((char)local_58 == '\0') && (puVar16 = puVar17, puVar2 = local_60, (char)local_50 == '\0')
         ) {
        puVar10 = puVar17;
        puVar16 = local_38;
      }
    }
    local_60 = puVar2;
    puVar17 = puVar22;
    puVar2 = puVar10;
    if ((char)local_50 != '\0') {
      puVar17 = local_40;
      puVar2 = puVar16;
    }
    if ((char)local_58 != '\0') {
      puVar17 = puVar23;
      puVar2 = local_60;
    }
    __ptr = (len_ran_intv *)0x0;
    local_6c = (uint)bVar19;
    plVar24 = (len_ran_intv *)0x0;
    local_38 = puVar16;
    do {
      if (plVar24 == (len_ran_intv *)0x0) {
        if (__ptr != (len_ran_intv *)0x0) {
          __assert_fail("!local_intv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0xc06,
                        "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                       );
        }
        plVar13 = (len_ran_intv *)malloc(0x28);
        __ptr = plVar13;
      }
      else {
        plVar13 = (len_ran_intv *)malloc(0x28);
        plVar24->next = plVar13;
      }
      if (plVar13 == (len_ran_intv *)0x0) {
        ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "resolve_len_ran_interval");
        plVar5 = local_80;
        goto joined_r0x001159c4;
      }
      plVar13->kind = (uint8_t)local_48;
      plVar13->type = type;
      plVar13->next = (len_ran_intv *)0x0;
      ppuVar14 = __ctype_b_loc();
      pcVar20 = str_restr;
      do {
        local_68 = pcVar20;
        cVar7 = *local_68;
        pcVar20 = local_68 + 1;
      } while (((*ppuVar14)[cVar7] >> 0xd & 1) != 0);
      if ((((*ppuVar14)[cVar7] >> 0xb & 1) != 0) || (cVar7 == '+')) {
LAB_0011562d:
        if ((char)local_58 != '\0') {
          uVar15 = strtoull(local_68,&local_68,10);
LAB_0011565a:
          (plVar13->value).uval.min = uVar15;
          goto LAB_001156b5;
        }
        if ((char)local_50 != '\0') {
          uVar15 = strtoll(local_68,&local_68,10);
          goto LAB_0011565a;
        }
        iVar9 = parse_range_dec64(&local_68,(uint8_t)local_6c,(int64_t *)&plVar13->value);
        if (iVar9 == 0) goto LAB_001156b5;
LAB_0011599e:
        ly_vlog(local_78,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_68,"range");
        plVar5 = local_80;
        goto joined_r0x001159c4;
      }
      plVar5 = local_80;
      if (cVar7 != 'm') {
        if (cVar7 == '-') goto LAB_0011562d;
        goto joined_r0x001159c4;
      }
      cVar7 = *pcVar20;
      if (cVar7 == 'i') {
        puVar16 = puVar17;
        if (local_68[2] != 'n') {
          cVar7 = *pcVar20;
          goto LAB_00115690;
        }
      }
      else {
LAB_00115690:
        if ((cVar7 != 'a') || (puVar16 = puVar2, local_68[2] != 'x')) goto joined_r0x001159c4;
      }
      (plVar13->value).sval.min = (int64_t)puVar16;
      local_68 = local_68 + 3;
LAB_001156b5:
      pcVar20 = local_68 + 1;
      do {
        pcVar21 = pcVar20;
        cVar7 = pcVar21[-1];
        pcVar20 = pcVar21 + 1;
      } while ((*(byte *)((long)*ppuVar14 + (long)cVar7 * 2 + 1) & 0x20) != 0);
      local_68 = pcVar21 + -1;
      if (cVar7 == '|') {
LAB_001156eb:
        puVar16 = (uint *)(plVar13->value).sval.min;
        if ((char)local_58 != '\0') goto LAB_0011575e;
        (plVar13->value).sval.max = (int64_t)puVar16;
        if ((char)local_50 != '\0') goto LAB_001157b7;
LAB_001157f7:
        lVar18 = (plVar13->value).sval.min;
        plVar5 = local_80;
        if ((((long)puVar16 < lVar18) || (lVar18 < (long)puVar22)) ||
           ((long)puVar10 < (long)puVar16)) goto joined_r0x001159c4;
LAB_0011581e:
        if ((plVar24 != (len_ran_intv *)0x0) &&
           (plVar5 = local_80, lVar18 <= (plVar24->value).sval.max)) goto joined_r0x001159c4;
      }
      else {
        plVar5 = local_80;
        if (cVar7 != '.') {
          if (cVar7 == '\0') goto LAB_001156eb;
          goto joined_r0x001159c4;
        }
        if (*pcVar21 != '.') goto joined_r0x001159c4;
        do {
          local_68 = pcVar20;
          cVar7 = *local_68;
          uVar1 = (*ppuVar14)[cVar7];
          pcVar20 = local_68 + 1;
        } while ((uVar1 >> 0xd & 1) != 0);
        if (((uVar1 >> 0xb & 1) == 0) && (cVar7 != '+')) {
          if (cVar7 == 'm') {
            if ((local_68[1] == 'a') && (local_68[2] == 'x')) {
              puVar16 = local_60;
              if ((char)local_58 != '\0') goto LAB_0011575e;
              puVar16 = local_38;
              if ((char)local_50 == '\0') {
                (plVar13->value).sval.max = (int64_t)puVar10;
                puVar16 = puVar10;
                goto LAB_001157f7;
              }
LAB_001157b3:
              (plVar13->value).sval.max = (int64_t)puVar16;
LAB_001157b7:
              lVar18 = (plVar13->value).sval.min;
              plVar5 = local_80;
              if (((lVar18 <= (long)puVar16) && ((long)local_40 <= lVar18)) &&
                 ((long)puVar16 <= (long)local_38)) goto LAB_0011581e;
            }
          }
          else if (cVar7 == '-') goto LAB_00115747;
          goto joined_r0x001159c4;
        }
LAB_00115747:
        if ((char)local_58 == '\0') {
          if ((char)local_50 != '\0') {
            puVar16 = (uint *)strtoll(local_68,&local_68,10);
            goto LAB_001157b3;
          }
          num = &(plVar13->value).sval.max;
          iVar9 = parse_range_dec64(&local_68,(uint8_t)local_6c,num);
          if (iVar9 != 0) goto LAB_0011599e;
          puVar16 = (uint *)*num;
          goto LAB_001157f7;
        }
        puVar16 = (uint *)strtoull(local_68,&local_68,10);
LAB_0011575e:
        (plVar13->value).sval.max = (int64_t)puVar16;
        puVar3 = (uint *)(plVar13->value).uval.min;
        plVar5 = local_80;
        if (((puVar16 < puVar3) || ((puVar3 < puVar23 || (local_60 < puVar16)))) ||
           ((plVar24 != (len_ran_intv *)0x0 && (puVar3 <= (uint *)(plVar24->value).uval.max))))
        goto joined_r0x001159c4;
      }
      pcVar20 = strchr(str_restr,0x7c);
      plVar6 = local_80;
      str_restr = pcVar20 + 1;
      plVar24 = plVar13;
    } while (pcVar20 != (char *)0x0);
    plVar13 = __ptr;
    plVar24 = local_80;
    if (local_80 != (len_ran_intv *)0x0) {
joined_r0x001158c2:
      plVar5 = plVar6;
      if (plVar13 != (len_ran_intv *)0x0) {
        do {
          num1 = (plVar13->value).sval.min;
          plVar5 = local_80;
          if ((char)local_58 == '\0') {
            if ((char)local_50 == '\0') {
              local_48 = (plVar13->value).sval.max;
              iVar9 = dec64cmp(num1,(uint8_t)local_6c,(plVar24->value).sval.min,(uint8_t)local_6c);
              if ((-1 < iVar9) &&
                 (iVar9 = dec64cmp(num1,(uint8_t)local_6c,(plVar24->value).sval.max,
                                   (uint8_t)local_6c), iVar9 < 1)) {
                iVar9 = dec64cmp(local_48,(uint8_t)local_6c,(plVar24->value).sval.max,
                                 (uint8_t)local_6c);
                plVar5 = local_80;
                if (iVar9 < 1) goto LAB_00115965;
                goto joined_r0x001159c4;
              }
            }
            else if (((plVar24->value).sval.min <= (long)num1) &&
                    (lVar18 = (plVar24->value).sval.max, (long)num1 <= lVar18)) {
              if (lVar18 < (plVar13->value).sval.max) goto joined_r0x001159c4;
              goto LAB_00115965;
            }
          }
          else if (((plVar24->value).uval.min <= num1) &&
                  (uVar4 = (plVar24->value).uval.max, num1 <= uVar4)) goto code_r0x001158e7;
          plVar24 = plVar24->next;
          plVar5 = local_80;
          if (plVar24 == (len_ran_intv *)0x0) goto joined_r0x001159c4;
        } while( true );
      }
      do {
        plVar24 = plVar5;
        plVar5 = plVar24->next;
      } while (plVar5 != (len_ran_intv *)0x0);
      plVar24->next = __ptr;
      __ptr = plVar6;
    }
  }
  *ret = __ptr;
  iVar9 = 0;
switchD_001151a3_caseD_2:
  return iVar9;
code_r0x001158e7:
  if (uVar4 < (plVar13->value).uval.max) {
joined_r0x001159c4:
    while (plVar5 != (len_ran_intv *)0x0) {
      plVar24 = plVar5->next;
      free(plVar5);
      plVar5 = plVar24;
    }
    while (__ptr != (len_ran_intv *)0x0) {
      plVar24 = __ptr->next;
      free(__ptr);
      __ptr = plVar24;
    }
    return -1;
  }
LAB_00115965:
  plVar13 = plVar13->next;
  goto joined_r0x001158c2;
}

Assistant:

int
resolve_len_ran_interval(struct ly_ctx *ctx, const char *str_restr, struct lys_type *type, struct len_ran_intv **ret)
{
    /* 0 - unsigned, 1 - signed, 2 - floating point */
    int kind;
    int64_t local_smin = 0, local_smax = 0, local_fmin, local_fmax;
    uint64_t local_umin, local_umax = 0;
    uint8_t local_fdig = 0;
    const char *seg_ptr, *ptr;
    struct len_ran_intv *local_intv = NULL, *tmp_local_intv = NULL, *tmp_intv, *intv = NULL;

    switch (type->base) {
    case LY_TYPE_BINARY:
        kind = 0;
        local_umin = 0;
        local_umax = 18446744073709551615UL;

        if (!str_restr && type->info.binary.length) {
            str_restr = type->info.binary.length->expr;
        }
        break;
    case LY_TYPE_DEC64:
        kind = 2;
        local_fmin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_fmax = __INT64_C(9223372036854775807);
        local_fdig = type->info.dec64.dig;

        if (!str_restr && type->info.dec64.range) {
            str_restr = type->info.dec64.range->expr;
        }
        break;
    case LY_TYPE_INT8:
        kind = 1;
        local_smin = __INT64_C(-128);
        local_smax = __INT64_C(127);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT16:
        kind = 1;
        local_smin = __INT64_C(-32768);
        local_smax = __INT64_C(32767);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT32:
        kind = 1;
        local_smin = __INT64_C(-2147483648);
        local_smax = __INT64_C(2147483647);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT64:
        kind = 1;
        local_smin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_smax = __INT64_C(9223372036854775807);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT8:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(255);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT16:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(65535);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT32:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(4294967295);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT64:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_STRING:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.str.length) {
            str_restr = type->info.str.length->expr;
        }
        break;
    default:
        return -1;
    }

    /* process superior types */
    if (type->der) {
        if (resolve_len_ran_interval(ctx, NULL, &type->der->type, &intv)) {
            return -1;
        }
        assert(!intv || (intv->kind == kind));
    }

    if (!str_restr) {
        /* we do not have any restriction, return superior ones */
        *ret = intv;
        return EXIT_SUCCESS;
    }

    /* adjust local min and max */
    if (intv) {
        tmp_intv = intv;

        if (kind == 0) {
            local_umin = tmp_intv->value.uval.min;
        } else if (kind == 1) {
            local_smin = tmp_intv->value.sval.min;
        } else if (kind == 2) {
            local_fmin = tmp_intv->value.fval.min;
        }

        while (tmp_intv->next) {
            tmp_intv = tmp_intv->next;
        }

        if (kind == 0) {
            local_umax = tmp_intv->value.uval.max;
        } else if (kind == 1) {
            local_smax = tmp_intv->value.sval.max;
        } else if (kind == 2) {
            local_fmax = tmp_intv->value.fval.max;
        }
    }

    /* finally parse our restriction */
    seg_ptr = str_restr;
    tmp_intv = NULL;
    while (1) {
        if (!tmp_local_intv) {
            assert(!local_intv);
            local_intv = malloc(sizeof *local_intv);
            tmp_local_intv = local_intv;
        } else {
            tmp_local_intv->next = malloc(sizeof *tmp_local_intv);
            tmp_local_intv = tmp_local_intv->next;
        }
        LY_CHECK_ERR_GOTO(!tmp_local_intv, LOGMEM(ctx), error);

        tmp_local_intv->kind = kind;
        tmp_local_intv->type = type;
        tmp_local_intv->next = NULL;

        /* min */
        ptr = seg_ptr;
        while (isspace(ptr[0])) {
            ++ptr;
        }
        if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = strtoull(ptr, (char **)&ptr, 10);
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = strtoll(ptr, (char **)&ptr, 10);
            } else if (kind == 2) {
                if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.min)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                    goto error;
                }
            }
        } else if (!strncmp(ptr, "min", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umin;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smin;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmin;
            }

            ptr += 3;
        } else if (!strncmp(ptr, "max", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umax;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smax;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmax;
            }

            ptr += 3;
        } else {
            goto error;
        }

        while (isspace(ptr[0])) {
            ptr++;
        }

        /* no interval or interval */
        if ((ptr[0] == '|') || !ptr[0]) {
            if (kind == 0) {
                tmp_local_intv->value.uval.max = tmp_local_intv->value.uval.min;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.max = tmp_local_intv->value.sval.min;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.max = tmp_local_intv->value.fval.min;
            }
        } else if (!strncmp(ptr, "..", 2)) {
            /* skip ".." */
            ptr += 2;
            while (isspace(ptr[0])) {
                ++ptr;
            }

            /* max */
            if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = strtoull(ptr, (char **)&ptr, 10);
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = strtoll(ptr, (char **)&ptr, 10);
                } else if (kind == 2) {
                    if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.max)) {
                        LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                        goto error;
                    }
                }
            } else if (!strncmp(ptr, "max", 3)) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = local_umax;
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = local_smax;
                } else if (kind == 2) {
                    tmp_local_intv->value.fval.max = local_fmax;
                }
            } else {
                goto error;
            }
        } else {
            goto error;
        }

        /* check min and max in correct order */
        if (kind == 0) {
            /* current segment */
            if (tmp_local_intv->value.uval.min > tmp_local_intv->value.uval.max) {
                goto error;
            }
            if (tmp_local_intv->value.uval.min < local_umin || tmp_local_intv->value.uval.max > local_umax) {
                goto error;
            }
            /* segments sholud be ascending order */
            if (tmp_intv && (tmp_intv->value.uval.max >= tmp_local_intv->value.uval.min)) {
                goto error;
            }
        } else if (kind == 1) {
            if (tmp_local_intv->value.sval.min > tmp_local_intv->value.sval.max) {
                goto error;
            }
            if (tmp_local_intv->value.sval.min < local_smin || tmp_local_intv->value.sval.max > local_smax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.sval.max >= tmp_local_intv->value.sval.min)) {
                goto error;
            }
        } else if (kind == 2) {
            if (tmp_local_intv->value.fval.min > tmp_local_intv->value.fval.max) {
                goto error;
            }
            if (tmp_local_intv->value.fval.min < local_fmin || tmp_local_intv->value.fval.max > local_fmax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.fval.max >= tmp_local_intv->value.fval.min)) {
                /* fraction-digits value is always the same (it cannot be changed in derived types) */
                goto error;
            }
        }

        /* next segment (next OR) */
        seg_ptr = strchr(seg_ptr, '|');
        if (!seg_ptr) {
            break;
        }
        seg_ptr++;
        tmp_intv = tmp_local_intv;
    }

    /* check local restrictions against superior ones */
    if (intv) {
        tmp_intv = intv;
        tmp_local_intv = local_intv;

        while (tmp_local_intv && tmp_intv) {
            /* reuse local variables */
            if (kind == 0) {
                local_umin = tmp_local_intv->value.uval.min;
                local_umax = tmp_local_intv->value.uval.max;

                /* it must be in this interval */
                if ((local_umin >= tmp_intv->value.uval.min) && (local_umin <= tmp_intv->value.uval.max)) {
                    /* this interval is covered, next one */
                    if (local_umax <= tmp_intv->value.uval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    /* ascending order of restrictions -> fail */
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 1) {
                local_smin = tmp_local_intv->value.sval.min;
                local_smax = tmp_local_intv->value.sval.max;

                if ((local_smin >= tmp_intv->value.sval.min) && (local_smin <= tmp_intv->value.sval.max)) {
                    if (local_smax <= tmp_intv->value.sval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 2) {
                local_fmin = tmp_local_intv->value.fval.min;
                local_fmax = tmp_local_intv->value.fval.max;

                 if ((dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.min, local_fdig) > -1)
                        && (dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1)) {
                    if (dec64cmp(local_fmax, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            }

            tmp_intv = tmp_intv->next;
        }

        /* some interval left uncovered -> fail */
        if (tmp_local_intv) {
            goto error;
        }
    }

    /* append the local intervals to all the intervals of the superior types, return it all */
    if (intv) {
        for (tmp_intv = intv; tmp_intv->next; tmp_intv = tmp_intv->next);
        tmp_intv->next = local_intv;
    } else {
        intv = local_intv;
    }
    *ret = intv;

    return EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }
    while (local_intv) {
        tmp_local_intv = local_intv->next;
        free(local_intv);
        local_intv = tmp_local_intv;
    }

    return -1;
}